

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

bool __thiscall clipp::group::depth_first_traverser::is_inside(depth_first_traverser *this,group *g)

{
  const_iterator __first;
  const_iterator __last;
  anon_class_8_1_54a39807_for__M_pred in_RSI;
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  *in_stack_ffffffffffffffb8;
  undefined1 local_1;
  
  if (in_RSI.g == (group *)0x0) {
    local_1 = false;
  }
  else {
    __first = std::
              vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ::begin(in_stack_ffffffffffffffb8);
    __last = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::end(in_stack_ffffffffffffffb8);
    local_1 = std::
              any_of<__gnu_cxx::__normal_iterator<clipp::group::depth_first_traverser::context_const*,std::vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>>,clipp::group::depth_first_traverser::is_inside(clipp::group_const*)const::_lambda(clipp::group::depth_first_traverser::context_const&)_1_>
                        ((__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                          )__first._M_current,
                         (__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                          )__last._M_current,in_RSI);
  }
  return local_1;
}

Assistant:

bool is_inside(const group* g) const noexcept {
            if(!g) return false;
            return std::any_of(stack_.begin(), stack_.end(),
                [g](const context& c) { return c.parent == g; });
        }